

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::MemberAccessExpressionSyntax::setChild
          (MemberAccessExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  Info *pIVar1;
  undefined1 uVar2;
  NumericTokenFlags NVar3;
  uint32_t uVar4;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar5;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar6;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar7;
  
  if (index == 2) {
    pvVar5 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar2 = pvVar5->field_0x2;
    NVar3.raw = (pvVar5->numFlags).raw;
    uVar4 = pvVar5->rawLen;
    pIVar1 = pvVar5->info;
    (this->name).kind = pvVar5->kind;
    (this->name).field_0x2 = uVar2;
    (this->name).numFlags = (NumericTokenFlags)NVar3.raw;
    (this->name).rawLen = uVar4;
    (this->name).info = pIVar1;
  }
  else if (index == 1) {
    pvVar5 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar2 = pvVar5->field_0x2;
    NVar3.raw = (pvVar5->numFlags).raw;
    uVar4 = pvVar5->rawLen;
    pIVar1 = pvVar5->info;
    (this->dot).kind = pvVar5->kind;
    (this->dot).field_0x2 = uVar2;
    (this->dot).numFlags = (NumericTokenFlags)NVar3.raw;
    (this->dot).rawLen = uVar4;
    (this->dot).info = pIVar1;
  }
  else {
    ppSVar6 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar6 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pSVar7 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0;
    }
    else {
      ppSVar6 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pSVar7 = *ppSVar6;
    }
    (this->left).ptr = (ExpressionSyntax *)pSVar7;
  }
  return;
}

Assistant:

void MemberAccessExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: left = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 1: dot = child.token(); return;
        case 2: name = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}